

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O3

void __thiscall
QOpenGLProgramBinaryCache::save(QOpenGLProgramBinaryCache *this,QByteArray *cacheKey,uint programId)

{
  long lVar1;
  int iVar2;
  char16_t *pcVar3;
  undefined1 *puVar4;
  Data *pDVar5;
  char *pcVar6;
  uint uVar7;
  qsizetype __n;
  qsizetype __n_00;
  qsizetype __n_01;
  QArrayData *pQVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  QOpenGLContext *this_00;
  QOpenGLExtraFunctions *pQVar14;
  undefined8 *puVar15;
  ulong uVar16;
  char *pcVar17;
  char *__s;
  int iVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  QStringView QVar20;
  QStringView QVar21;
  GLint outSize;
  quint32 blobFormat;
  GLint blobSize;
  GLEnvInfo info;
  QArrayData *local_110;
  undefined8 *local_108;
  QString local_f8;
  uint local_e0;
  undefined4 local_dc;
  QByteArray local_d8;
  QString local_b8;
  char *local_a0;
  uint local_8c;
  GLEnvInfo local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_cacheWritable != true) goto LAB_0055fdc2;
  local_88.glversion.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.glversion.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.glversion.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_88.glrenderer.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_88.glrenderer.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.glvendor.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.glrenderer.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.glvendor.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.glvendor.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_1b21d93::GLEnvInfo::GLEnvInfo(&local_88);
  this_00 = QOpenGLContext::currentContext();
  pQVar14 = QOpenGLContext::extraFunctions(this_00);
  local_8c = 0;
  do {
    iVar11 = (*(((pQVar14->super_QOpenGLFunctions).d_ptr)->field_0).functions[0x17])();
    if (iVar11 == 0x507) break;
  } while (iVar11 != 0);
  (*(((pQVar14->super_QOpenGLFunctions).d_ptr)->field_0).functions[0x55])
            ((ulong)programId,0x8741,&local_8c);
  __n_01 = local_88.glversion.d.size;
  __n_00 = local_88.glrenderer.d.size;
  __n = local_88.glvendor.d.size;
  iVar11 = (int)local_88.glrenderer.d.size;
  iVar2 = (int)local_88.glvendor.d.size;
  iVar18 = iVar11 + iVar2;
  iVar12 = (int)local_88.glversion.d.size;
  uVar16 = (long)(iVar12 + iVar18 + 0x27) & 0xfffffffffffffffc;
  uVar19 = (long)(int)local_8c + uVar16;
  QtPrivateLogging::lcOpenGLProgramDiskCache();
  uVar7 = local_8c;
  if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
             _q_value._M_base._M_i & 1) != 0) {
    local_b8.d.d._0_4_ = 2;
    local_b8.d.d._4_4_ = 0;
    local_b8.d.ptr._0_4_ = 0;
    local_b8.d.ptr._4_4_ = 0;
    local_b8.d.size._0_4_ = 0;
    local_b8.d.size._4_4_ = 0;
    local_a0 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
    uVar13 = (*(((pQVar14->super_QOpenGLFunctions).d_ptr)->field_0).functions[0x17])();
    QMessageLogger::debug
              ((char *)&local_b8,"Program binary is %d bytes, err = 0x%x, total %d",(ulong)uVar7,
               (ulong)uVar13,uVar19 & 0xffffffff);
  }
  if (local_8c != 0) {
    iVar18 = (int)uVar16 - (iVar12 + iVar18 + 0x1c);
    local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_d8,uVar19,Uninitialized);
    if ((&(local_d8.d.d)->super_QArrayData == (QArrayData *)0x0) ||
       (1 < ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_d8,(AllocationOption)local_d8.d.size);
    }
    pcVar6 = local_d8.d.ptr;
    local_d8.d.ptr[0] = 't';
    local_d8.d.ptr[1] = 'Q';
    local_d8.d.ptr[2] = '\0';
    local_d8.d.ptr[3] = '\0';
    local_d8.d.ptr[4] = '\x03';
    local_d8.d.ptr[5] = '\0';
    local_d8.d.ptr[6] = '\0';
    local_d8.d.ptr[7] = '\0';
    local_d8.d.ptr[8] = '\0';
    local_d8.d.ptr[9] = '\n';
    local_d8.d.ptr[10] = '\x06';
    local_d8.d.ptr[0xb] = '\0';
    local_d8.d.ptr[0xc] = '\b';
    local_d8.d.ptr[0xd] = '\0';
    local_d8.d.ptr[0xe] = '\0';
    local_d8.d.ptr[0xf] = '\0';
    *(int *)(local_d8.d.ptr + 0x10) = iVar2;
    pcVar17 = local_88.glvendor.d.ptr;
    if (local_88.glvendor.d.ptr == (char *)0x0) {
      pcVar17 = (char *)&QByteArray::_empty;
    }
    memcpy(local_d8.d.ptr + 0x14,pcVar17,__n);
    *(int *)(pcVar6 + (long)(__n + 0x14)) = iVar11;
    pcVar17 = local_88.glrenderer.d.ptr;
    if (local_88.glrenderer.d.ptr == (char *)0x0) {
      pcVar17 = (char *)&QByteArray::_empty;
    }
    memcpy(pcVar6 + (long)(__n + 0x18),pcVar17,__n_00);
    *(int *)(pcVar6 + (long)((undefined1 *)(__n_00 + 8) + (long)(__n + 0x14)) + -4) = iVar12;
    pcVar17 = local_88.glversion.d.ptr;
    if (local_88.glversion.d.ptr == (char *)0x0) {
      pcVar17 = (char *)&QByteArray::_empty;
    }
    memcpy(pcVar6 + (long)((undefined1 *)(__n_00 + 8) + (long)(__n + 0x14)),pcVar17,__n_01);
    local_dc = 0;
    puVar4 = (undefined1 *)(__n_01 + (long)((undefined1 *)(__n_00 + (long)(__n + 0x14)) + 4));
    __s = pcVar6 + (long)(puVar4 + 0xc);
    pcVar17 = pcVar6 + (long)(puVar4 + 4);
    pcVar17[0] = '\0';
    pcVar17[1] = '\0';
    pcVar17[2] = '\0';
    pcVar17[3] = '\0';
    *(uint *)(pcVar6 + (long)(puVar4 + 8)) = local_8c;
    if (0 < iVar18 + -8) {
      uVar16 = (ulong)(iVar18 - 9);
      memset(__s,0,uVar16 + 1);
      __s = pcVar6 + (long)((undefined1 *)(__n_00 + __n) + __n_01 + uVar16 + 0x25);
    }
    local_e0 = 0;
    (*(pQVar14->super_QOpenGLFunctions).d_ptr[1].field_0.functions[0x60])
              ((ulong)programId,(ulong)local_8c,&local_e0,&local_dc,__s);
    if (local_8c == local_e0) {
      *(undefined4 *)
       (pcVar6 + (long)((undefined1 *)
                        (__n_01 + (long)((undefined1 *)(__n_00 + (long)(__n + 0x14)) + 4)) + 4)) =
           local_dc;
      local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      cacheFileName(&local_f8,this,cacheKey);
      local_b8.d.d._0_4_ = 0xaaaaaaaa;
      local_b8.d.d._4_4_ = 0xaaaaaaaa;
      local_b8.d.ptr._0_4_ = 0xaaaaaaaa;
      local_b8.d.ptr._4_4_ = 0xaaaaaaaa;
      QSaveFile::QSaveFile((QSaveFile *)&local_b8,(QString *)&local_f8);
      cVar9 = QSaveFile::open((QSaveFile *)&local_b8,10);
      if (cVar9 == '\0') {
LAB_0055fae7:
        QSaveFile::~QSaveFile((QSaveFile *)&local_b8);
        lVar1 = (this->m_currentCacheDir).d.size;
        if (lVar1 == (this->m_globalCacheDir).d.size) {
          QVar20.m_data = (this->m_currentCacheDir).d.ptr;
          QVar20.m_size = lVar1;
          QVar21.m_data = (this->m_globalCacheDir).d.ptr;
          QVar21.m_size = lVar1;
          cVar9 = QtPrivate::equalStrings(QVar20,QVar21);
          if (cVar9 != '\0') {
            QString::operator=(&this->m_currentCacheDir,(QString *)&this->m_localCacheDir);
            bVar10 = qt_ensureWritableDir(&this->m_currentCacheDir);
            this->m_cacheWritable = bVar10;
            QtPrivateLogging::lcOpenGLProgramDiskCache();
            if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.
                       enabledDebug._q_value._M_base._M_i & 1) != 0) {
              local_b8.d.d._0_4_ = 2;
              local_b8.d.d._4_4_ = 0;
              local_b8.d.ptr._0_4_ = 0;
              local_b8.d.ptr._4_4_ = 0;
              local_b8.d.size._0_4_ = 0;
              local_b8.d.size._4_4_ = 0;
              local_a0 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
              QString::toLocal8Bit_helper
                        ((QChar *)&local_110,(longlong)(this->m_currentCacheDir).d.ptr);
              puVar15 = local_108;
              if (local_108 == (undefined8 *)0x0) {
                puVar15 = &QByteArray::_empty;
              }
              QMessageLogger::debug
                        ((char *)&local_b8,"Cache location changed to \'%s\' writable = %d",puVar15,
                         (ulong)this->m_cacheWritable);
              if (local_110 != (QArrayData *)0x0) {
                LOCK();
                (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_110,1,0x10);
                }
              }
            }
            if (this->m_cacheWritable != false) {
              cacheFileName(&local_b8,this,cacheKey);
              pDVar5 = local_f8.d.d;
              pQVar8 = (QArrayData *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_);
              pcVar3 = (char16_t *)CONCAT44(local_b8.d.ptr._4_4_,local_b8.d.ptr._0_4_);
              local_b8.d.d._0_4_ = SUB84(local_f8.d.d,0);
              local_b8.d.d._4_4_ = (undefined4)((ulong)local_f8.d.d >> 0x20);
              puVar4 = (undefined1 *)CONCAT44(local_b8.d.size._4_4_,(undefined4)local_b8.d.size);
              local_b8.d.ptr._0_4_ = SUB84(local_f8.d.ptr,0);
              local_b8.d.ptr._4_4_ = (undefined4)((ulong)local_f8.d.ptr >> 0x20);
              local_b8.d.size._0_4_ = (undefined4)local_f8.d.size;
              local_b8.d.size._4_4_ = (undefined4)((ulong)local_f8.d.size >> 0x20);
              local_f8.d.ptr = pcVar3;
              local_f8.d.size = (qsizetype)puVar4;
              if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  local_f8.d.d = (Data *)pQVar8;
                  QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
                  pQVar8 = &(local_f8.d.d)->super_QArrayData;
                }
              }
              local_f8.d.d = (Data *)pQVar8;
              bVar10 = writeFile(&local_f8,&local_d8);
              if (bVar10) goto LAB_0055fd01;
            }
          }
        }
        QtPrivateLogging::lcOpenGLProgramDiskCache();
        if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                   _q_value._M_base._M_i & 1) != 0) {
          local_b8.d.d._0_4_ = 2;
          local_b8.d.d._4_4_ = 0;
          local_b8.d.ptr._0_4_ = 0;
          local_b8.d.ptr._4_4_ = 0;
          local_b8.d.size._0_4_ = 0;
          local_b8.d.size._4_4_ = 0;
          local_a0 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
          QString::toLocal8Bit_helper((QChar *)&local_110,(longlong)local_f8.d.ptr);
          if (local_108 == (undefined8 *)0x0) {
            local_108 = &QByteArray::_empty;
          }
          QMessageLogger::debug((char *)&local_b8,"Failed to write %s to shader cache",local_108);
          if (local_110 != (QArrayData *)0x0) {
            LOCK();
            (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_110,1,0x10);
            }
          }
        }
      }
      else {
        QIODevice::write((QByteArray *)&local_b8);
        cVar9 = QSaveFile::commit();
        if (cVar9 == '\0') goto LAB_0055fae7;
        QSaveFile::~QSaveFile((QSaveFile *)&local_b8);
      }
LAB_0055fd01:
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      QtPrivateLogging::lcOpenGLProgramDiskCache();
      if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                 _q_value._M_base._M_i & 1) != 0) {
        local_b8.d.d._0_4_ = 2;
        local_b8.d.d._4_4_ = 0;
        local_b8.d.ptr._0_4_ = 0;
        local_b8.d.ptr._4_4_ = 0;
        local_b8.d.size._0_4_ = 0;
        local_b8.d.size._4_4_ = 0;
        local_a0 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
        QMessageLogger::debug
                  ((char *)&local_b8,"glGetProgramBinary returned size %d instead of %d",
                   (ulong)local_e0,(ulong)local_8c);
      }
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (&(local_88.glversion.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.glversion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.glversion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.glversion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_88.glversion.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_88.glrenderer.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.glrenderer.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.glrenderer.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.glrenderer.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_88.glrenderer.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_88.glvendor.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.glvendor.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.glvendor.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.glvendor.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.glvendor.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_0055fdc2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLProgramBinaryCache::save(const QByteArray &cacheKey, uint programId)
{
    if (!m_cacheWritable)
        return;

    GLEnvInfo info;

    QOpenGLContext *context = QOpenGLContext::currentContext();
    QOpenGLExtraFunctions *funcs = context->extraFunctions();
    GLint blobSize = 0;
    while (true) {
        GLenum error = funcs->glGetError();
        if (error == GL_NO_ERROR || error == GL_CONTEXT_LOST)
            break;
    }
    funcs->glGetProgramiv(programId, GL_PROGRAM_BINARY_LENGTH, &blobSize);

    const int headerSize = FULL_HEADER_SIZE(info.glvendor.size() + info.glrenderer.size() + info.glversion.size());

    // Add padding to make the blob start 4-byte aligned in order to support
    // OpenGL implementations on ARM that choke on non-aligned pointers passed
    // to glProgramBinary.
    const int paddingSize = PADDING_SIZE(headerSize);

    const int totalSize = headerSize + paddingSize + blobSize;

    qCDebug(lcOpenGLProgramDiskCache, "Program binary is %d bytes, err = 0x%x, total %d", blobSize, funcs->glGetError(), totalSize);
    if (!blobSize)
        return;

    QByteArray blob(totalSize, Qt::Uninitialized);
    uchar *p = reinterpret_cast<uchar *>(blob.data());

    writeUInt(&p, BINSHADER_MAGIC);
    writeUInt(&p, BINSHADER_VERSION);
    writeUInt(&p, BINSHADER_QTVERSION);
    writeUInt(&p, sizeof(quintptr));

    writeStr(&p, info.glvendor);
    writeStr(&p, info.glrenderer);
    writeStr(&p, info.glversion);

    quint32 blobFormat = 0;
    uchar *blobFormatPtr = p;
    writeUInt(&p, blobFormat);
    writeUInt(&p, blobSize);

    for (int i = 0; i < paddingSize; ++i)
        *p++ = 0;

    GLint outSize = 0;
#if QT_CONFIG(opengles2)
    if (context->isOpenGLES() && context->format().majorVersion() < 3) {
        QMutexLocker lock(&m_mutex);
        initializeProgramBinaryOES(context);
        getProgramBinaryOES(programId, blobSize, &outSize, &blobFormat, p);
    } else
#endif
    funcs->glGetProgramBinary(programId, blobSize, &outSize, &blobFormat, p);
    if (blobSize != outSize) {
        qCDebug(lcOpenGLProgramDiskCache, "glGetProgramBinary returned size %d instead of %d", outSize, blobSize);
        return;
    }

    writeUInt(&blobFormatPtr, blobFormat);

    QString filename = cacheFileName(cacheKey);
    bool ok = writeFile(filename, blob);
    if (!ok && m_currentCacheDir == m_globalCacheDir) {
        m_currentCacheDir = m_localCacheDir;
        m_cacheWritable = qt_ensureWritableDir(m_currentCacheDir);
        qCDebug(lcOpenGLProgramDiskCache, "Cache location changed to '%s' writable = %d",
                qPrintable(m_currentCacheDir), m_cacheWritable);
        if (m_cacheWritable) {
            filename = cacheFileName(cacheKey);
            ok = writeFile(filename, blob);
        }
    }
    if (!ok)
        qCDebug(lcOpenGLProgramDiskCache, "Failed to write %s to shader cache", qPrintable(filename));
}